

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeOneExtensionRange
          (MessageGenerator *this,Printer *p,int start,int end)

{
  long lVar1;
  allocator<char> local_1fa;
  allocator<char> local_1f9;
  int end_local;
  int start_local;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1039:28)>
  v;
  string local_1e0;
  string local_1c0;
  Sub local_1a0 [2];
  
  end_local = end;
  start_local = start;
  io::Printer::
  WithVars<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>&,void,void>
            (&v,p,&this->variables_);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"start",&local_1f9);
  io::Printer::Sub::Sub<int&>(local_1a0,&local_1c0,&start_local);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"end",&local_1fa);
  io::Printer::Sub::Sub<int&>(local_1a0 + 1,&local_1e0,&end_local);
  io::Printer::Emit(p,local_1a0,2,0xad,
                    "\n        // Extension range [$start$, $end$)\n        target = this_.$extensions$._InternalSerialize(\n            &default_instance(), $start$, $end$, target, stream);\n      "
                   );
  lVar1 = 0xb8;
  do {
    io::Printer::Sub::~Sub((Sub *)((long)&local_1a0[0].key_._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0xb8;
  } while (lVar1 != -0xb8);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1039:28)>
  ::~Cleanup(&v);
  return;
}

Assistant:

void MessageGenerator::GenerateSerializeOneExtensionRange(io::Printer* p,
                                                          int start, int end) {
  auto v = p->WithVars(variables_);
  p->Emit(  //
      {{"start", start}, {"end", end}},
      R"cc(
        // Extension range [$start$, $end$)
        target = this_.$extensions$._InternalSerialize(
            &default_instance(), $start$, $end$, target, stream);
      )cc");
}